

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O0

int archive_read_append_filter(archive *_a,int code)

{
  int iVar1;
  archive *_a_00;
  archive_read_filter *paVar2;
  uint in_ESI;
  archive_read *in_RDI;
  archive_read *a;
  archive_read_filter *filter;
  archive_read_filter_bidder *bidder;
  char str [20];
  int i;
  int number_bidders;
  int r2;
  int r1;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  archive_read_filter_bidder *local_40;
  char local_38 [20];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  int local_4;
  
  local_1c = 0;
  local_18 = 0;
  _a_00 = (archive *)(ulong)in_ESI;
  local_14 = in_ESI;
  switch(_a_00) {
  case (archive *)0x0:
    local_18 = 0;
    break;
  case (archive *)0x1:
    strcpy(local_38,"gzip");
    local_18 = archive_read_support_filter_gzip(_a_00);
    break;
  case (archive *)0x2:
    strcpy(local_38,"bzip2");
    local_18 = archive_read_support_filter_bzip2(_a_00);
    break;
  case (archive *)0x3:
    strcpy(local_38,"compress (.Z)");
    local_18 = archive_read_support_filter_compress(_a_00);
    break;
  case (archive *)0x4:
    archive_set_error(&in_RDI->archive,0x16,
                      "Cannot append program filter using archive_read_append_filter");
    return -0x1e;
  case (archive *)0x5:
    strcpy(local_38,"lzma");
    local_18 = archive_read_support_filter_lzma(_a_00);
    break;
  case (archive *)0x6:
    strcpy(local_38,"xz");
    local_18 = archive_read_support_filter_xz(_a_00);
    break;
  case (archive *)0x7:
    strcpy(local_38,"uu");
    local_18 = archive_read_support_filter_uu(_a_00);
    break;
  case (archive *)0x8:
    strcpy(local_38,"rpm");
    local_18 = archive_read_support_filter_rpm(_a_00);
    break;
  case (archive *)0x9:
    strcpy(local_38,"lzip");
    local_18 = archive_read_support_filter_lzip(_a_00);
    break;
  case (archive *)0xa:
    strcpy(local_38,"lrzip");
    local_18 = archive_read_support_filter_lrzip(_a_00);
    break;
  default:
    archive_set_error(&in_RDI->archive,0x16,"Invalid filter code specified");
    return -0x1e;
  }
  if (local_14 != 0) {
    local_20 = 0xe;
    local_40 = in_RDI->bidders;
    local_24 = 0;
    while (((local_24 < local_20 && (local_40->name != (char *)0x0)) &&
           (iVar1 = strcmp(local_40->name,local_38), iVar1 != 0))) {
      local_24 = local_24 + 1;
      local_40 = local_40 + 1;
    }
    if ((local_40->name == (char *)0x0) || (iVar1 = strcmp(local_40->name,local_38), iVar1 != 0)) {
      archive_set_error(&in_RDI->archive,0x16,"Internal error: Unable to append filter");
      return -0x1e;
    }
    paVar2 = (archive_read_filter *)calloc(1,0xb0);
    if (paVar2 == (archive_read_filter *)0x0) {
      archive_set_error(&in_RDI->archive,0xc,"Out of memory");
      return -0x1e;
    }
    paVar2->bidder = local_40;
    paVar2->archive = in_RDI;
    paVar2->upstream = in_RDI->filter;
    in_RDI->filter = paVar2;
    local_1c = (*local_40->init)(in_RDI->filter);
    if (local_1c != 0) {
      __archive_read_close_filters(in_RDI);
      __archive_read_free_filters
                ((archive_read *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      return -0x1e;
    }
    local_1c = 0;
  }
  in_RDI->bypass_filter_bidding = 1;
  local_4 = local_1c;
  if (local_18 < local_1c) {
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int
archive_read_append_filter(struct archive *_a, int code)
{
  int r1, r2, number_bidders, i;
  char str[20];
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  r1 = r2 = (ARCHIVE_OK);
  switch (code)
  {
    case ARCHIVE_FILTER_NONE:
      /* No filter to add, so do nothing.
       * NOTE: An initial "NONE" type filter is always set at the end of the
       * filter chain.
       */
      r1 = (ARCHIVE_OK);
      break;
    case ARCHIVE_FILTER_GZIP:
      strcpy(str, "gzip");
      r1 = archive_read_support_filter_gzip(_a);
      break;
    case ARCHIVE_FILTER_BZIP2:
      strcpy(str, "bzip2");
      r1 = archive_read_support_filter_bzip2(_a);
      break;
    case ARCHIVE_FILTER_COMPRESS:
      strcpy(str, "compress (.Z)");
      r1 = archive_read_support_filter_compress(_a);
      break;
    case ARCHIVE_FILTER_PROGRAM:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Cannot append program filter using archive_read_append_filter");
      return (ARCHIVE_FATAL);
    case ARCHIVE_FILTER_LZMA:
      strcpy(str, "lzma");
      r1 = archive_read_support_filter_lzma(_a);
      break;
    case ARCHIVE_FILTER_XZ:
      strcpy(str, "xz");
      r1 = archive_read_support_filter_xz(_a);
      break;
    case ARCHIVE_FILTER_UU:
      strcpy(str, "uu");
      r1 = archive_read_support_filter_uu(_a);
      break;
    case ARCHIVE_FILTER_RPM:
      strcpy(str, "rpm");
      r1 = archive_read_support_filter_rpm(_a);
      break;
    case ARCHIVE_FILTER_LZIP:
      strcpy(str, "lzip");
      r1 = archive_read_support_filter_lzip(_a);
      break;
    case ARCHIVE_FILTER_LRZIP:
      strcpy(str, "lrzip");
      r1 = archive_read_support_filter_lrzip(_a);
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid filter code specified");
      return (ARCHIVE_FATAL);
  }

  if (code != ARCHIVE_FILTER_NONE)
  {
    number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

    bidder = a->bidders;
    for (i = 0; i < number_bidders; i++, bidder++)
    {
      if (!bidder->name || !strcmp(bidder->name, str))
        break;
    }
    if (!bidder->name || strcmp(bidder->name, str))
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Internal error: Unable to append filter");
      return (ARCHIVE_FATAL);
    }

    filter
        = (struct archive_read_filter *)calloc(1, sizeof(*filter));
    if (filter == NULL)
    {
      archive_set_error(&a->archive, ENOMEM, "Out of memory");
      return (ARCHIVE_FATAL);
    }
    filter->bidder = bidder;
    filter->archive = a;
    filter->upstream = a->filter;
    a->filter = filter;
    r2 = (bidder->init)(a->filter);
    if (r2 != ARCHIVE_OK) {
      __archive_read_close_filters(a);
      __archive_read_free_filters(a);
      return (ARCHIVE_FATAL);
    }
  }

  a->bypass_filter_bidding = 1;
  return (r1 < r2) ? r1 : r2;
}